

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Segment * reflection(Segment *segment,Plane *plane)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  Segment *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar3 = (segment->b).x;
  uVar5 = (segment->b).y;
  fVar1 = (segment->b).z;
  fVar8 = (float)uVar3 - (segment->a).x;
  fVar9 = (float)uVar5 - (segment->a).y;
  fVar10 = fVar1 - (segment->a).z;
  uVar4 = (plane->normal).x;
  uVar6 = (plane->normal).y;
  fVar2 = (plane->normal).z;
  fVar11 = fVar10 * fVar2 + fVar8 * (float)uVar4 + fVar9 * (float)uVar6;
  fVar11 = fVar11 + fVar11;
  (in_RDI->a).z = (segment->b).z;
  fVar7 = (segment->b).y;
  (in_RDI->a).x = (segment->b).x;
  (in_RDI->a).y = fVar7;
  (in_RDI->b).x = (fVar8 - (float)uVar4 * fVar11) + (float)uVar3;
  (in_RDI->b).y = (fVar9 - (float)uVar6 * fVar11) + (float)uVar5;
  (in_RDI->b).z = (fVar10 - fVar11 * fVar2) + fVar1;
  return in_RDI;
}

Assistant:

Segment reflection(Segment const& segment, Plane const& plane)
{
  Vector ri = segment.b - segment.a;
  ri -= plane.normal * (2 * dotProduct(ri, plane.normal));
  return {segment.b, segment.b + ri};
}